

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

link_type __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::allocator_with_state<int>>
::m_create_node<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::allocator_with_state<int>>
           *this,exception_ptr_error *err,int *args)

{
  bool bVar1;
  rb_tree_node<int> *prVar2;
  rb_tree_node<int> *prVar3;
  deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>_>
  guard;
  
  prVar2 = test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::
           allocate<nestl::has_exceptions::exception_ptr_error>
                     ((allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *)this,err,1,
                      (void *)0x0);
  bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  prVar3 = (rb_tree_node<int> *)0x0;
  if (!bVar1) {
    guard.m_size = 1;
    (prVar2->m_storage).m_storage = (storage_type)*args;
    guard.m_alloc = (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *)this;
    guard.m_ptr = prVar2;
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar1) {
      prVar2 = (rb_tree_node<int> *)0x0;
    }
    else {
      guard.m_ptr = (rb_tree_node<int> *)0x0;
    }
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<int>_*,_nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>_>
    ::~deallocation_scoped_guard(&guard);
    prVar3 = prVar2;
  }
  return prVar3;
}

Assistant:

link_type m_create_node(OperationError& err, Args&&... args) NESTL_NOEXCEPT_SPEC
    {
        node_allocator& node_alloc = m_get_node_allocator();
        link_type l = node_allocator_traits::allocate(err, node_alloc, 1);
        if (err)
        {
            return nullptr;
        }

        nestl::detail::deallocation_scoped_guard<link_type, node_allocator> guard(node_alloc, l, 1);

        l->construct_val(err, std::forward<Args>(args)...);
        if (err)
        {
            return nullptr;
        }

        guard.release();
        return l;
    }